

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

Loader * __thiscall Loader::shiftDR(Loader *this,int bits,string *write)

{
  undefined8 uVar1;
  uint uVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  string *in_RCX;
  undefined4 in_register_00000034;
  undefined8 *puVar6;
  allocator local_89;
  undefined4 local_88;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  string data;
  allocator local_29 [9];
  string *write_local;
  undefined8 *puStack_18;
  int bits_local;
  Loader *this_local;
  
  puVar6 = (undefined8 *)CONCAT44(in_register_00000034,bits);
  write_local._4_4_ = (uint)write;
  puStack_18 = puVar6;
  this_local = this;
  bVar3 = Jtag::navigateToState((Jtag *)*puVar6,*(State *)(puVar6 + 1),SHIFT_DR);
  uVar2 = write_local._4_4_;
  if (bVar3) {
    uVar1 = *puVar6;
    std::__cxx11::string::string(local_80,in_RCX);
    Jtag::shiftData((Jtag *)local_60,(uint)uVar1,(string *)(ulong)uVar2);
    std::__cxx11::string::~string(local_80);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      bVar3 = Jtag::navigateToState((Jtag *)*puVar6,EXIT1_DR,RUN_TEST_IDLE);
      if (bVar3) {
        *(undefined4 *)(puVar6 + 1) = 1;
        std::__cxx11::string::string((string *)this,(string *)local_60);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to change to RUN_TEST_IDLE state!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,(char *)0x0,&local_89);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to shift data!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,(char *)0x0,&local_81);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    local_88 = 1;
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to change to SHIFT_DR state!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,(char *)0x0,local_29);
    std::allocator<char>::~allocator((allocator<char> *)local_29);
  }
  return this;
}

Assistant:

string Loader::shiftDR(int bits, string write) {
	if (!device->navigateToState(currentState, Jtag_fsm::SHIFT_DR)) {
		cerr << "Failed to change to SHIFT_DR state!" << endl;
		return NULL;
	}

	string data = device->shiftData(bits, write);
	if (data.empty()) {
		cerr << "Failed to shift data!" << endl;
		return NULL;
	}
	if (!device->navigateToState(Jtag_fsm::EXIT1_DR, Jtag_fsm::RUN_TEST_IDLE)) {
		cerr << "Failed to change to RUN_TEST_IDLE state!" << endl;
		return NULL;
	}
	currentState = Jtag_fsm::RUN_TEST_IDLE;
	return data;
}